

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode.hpp
# Opt level: O2

size_t plot::utf8_string_width<char_const*>(char *first,char *last)

{
  char32_t __c;
  int iVar1;
  undefined4 extraout_var;
  size_t width;
  size_t sVar2;
  
  sVar2 = 0;
  for (; first != last; first = detail::utf8_next<char_const*>(first,last)) {
    __c = detail::utf8_cp<char_const*>(first,last);
    iVar1 = detail::wcwidth(__c);
    sVar2 = sVar2 + CONCAT44(extraout_var,iVar1);
  }
  return sVar2;
}

Assistant:

std::size_t utf8_string_width(Iterator first, Iterator last) {
    std::size_t width = 0;

    for (; first != last; first = detail::utf8_next(first, last))
        width += detail::wcwidth(detail::utf8_cp(first, last));

    return width;
}